

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BerdyHelper.cpp
# Opt level: O0

void __thiscall iDynTree::BerdyHelper::cacheSensorsOrdering(BerdyHelper *this)

{
  ulong uVar1;
  undefined8 *puVar2;
  SensorType *pSVar3;
  long lVar4;
  long lVar5;
  value_type *pvVar6;
  long in_RDI;
  IndexRange IVar7;
  BerdySensor linkSensor;
  IndexRange sensorRange_5;
  BerdySensor jointSens_1;
  IndexRange sensorRange_4;
  size_t i;
  BerdySensor linkSens;
  IndexRange sensorRange_3;
  LinkIndex idx_2;
  BerdySensor jointSens;
  IndexRange sensorRange_2;
  DOFIndex idx_1;
  BerdySensor jointAcc;
  IndexRange sensorRange_1;
  DOFIndex idx;
  BerdySensor sensor;
  IndexRange sensorRange;
  Iterator it;
  uint size;
  undefined4 in_stack_fffffffffffffc78;
  BerdySensorTypes in_stack_fffffffffffffc7c;
  BerdyHelper *in_stack_fffffffffffffc80;
  value_type *in_stack_fffffffffffffc88;
  __normal_iterator<iDynTree::BerdySensor_*,_std::vector<iDynTree::BerdySensor,_std::allocator<iDynTree::BerdySensor>_>_>
  __last;
  __normal_iterator<iDynTree::BerdySensor_*,_std::vector<iDynTree::BerdySensor,_std::allocator<iDynTree::BerdySensor>_>_>
  in_stack_fffffffffffffc90;
  undefined8 in_stack_fffffffffffffc98;
  BerdyHelper *in_stack_fffffffffffffca0;
  string *psVar8;
  size_type in_stack_fffffffffffffca8;
  vector<iDynTree::BerdySensor,_std::allocator<iDynTree::BerdySensor>_> *in_stack_fffffffffffffcb0;
  string local_2c8 [32];
  ptrdiff_t local_2a8;
  ptrdiff_t pStack_2a0;
  IndexRange local_298;
  undefined1 local_288 [72];
  ptrdiff_t local_240;
  ptrdiff_t pStack_238;
  IndexRange local_230;
  value_type *local_220;
  undefined1 local_218 [72];
  ptrdiff_t local_1d0;
  ptrdiff_t pStack_1c8;
  IndexRange local_1c0;
  long local_1b0;
  string local_1a8 [32];
  undefined4 local_188;
  string local_180 [32];
  ptrdiff_t local_160;
  ptrdiff_t pStack_158;
  IndexRange local_150;
  long local_140;
  string local_138 [32];
  undefined4 local_118;
  string local_110 [32];
  ptrdiff_t local_f0;
  ptrdiff_t pStack_e8;
  IndexRange local_e0;
  long local_d0;
  string local_c8 [40];
  string local_a0 [32];
  IndexRange local_80;
  string local_60 [36];
  string local_3c [4];
  undefined1 local_38 [16];
  Iterator local_28 [28];
  undefined4 local_c;
  
  local_c = 0;
  std::vector<iDynTree::BerdySensor,_std::allocator<iDynTree::BerdySensor>_>::clear
            ((vector<iDynTree::BerdySensor,_std::allocator<iDynTree::BerdySensor>_> *)0x520376);
  std::vector<iDynTree::BerdySensor,_std::allocator<iDynTree::BerdySensor>_>::reserve
            (in_stack_fffffffffffffcb0,in_stack_fffffffffffffca8);
  iDynTree::Model::sensors();
  iDynTree::SensorsList::allSensorsIterator();
  while( true ) {
    uVar1 = iDynTree::SensorsList::Iterator::isValid();
    if ((uVar1 & 1) == 0) break;
    puVar2 = (undefined8 *)iDynTree::SensorsList::Iterator::operator*(local_28);
    (**(code **)(*(long *)*puVar2 + 0x18))();
    pSVar3 = (SensorType *)iDynTree::Model::sensors();
    puVar2 = (undefined8 *)iDynTree::SensorsList::Iterator::operator*(local_28);
    local_3c = (string  [4])(**(code **)(*(long *)*puVar2 + 0x18))();
    puVar2 = (undefined8 *)iDynTree::SensorsList::Iterator::operator*(local_28);
    (**(code **)(*(long *)*puVar2 + 0x10))();
    iDynTree::SensorsList::getSensorIndex(pSVar3,local_3c);
    IVar7 = getRangeSensorVariable
                      (in_stack_fffffffffffffca0,
                       (SensorType)((ulong)in_stack_fffffffffffffc98 >> 0x20),
                       (uint)in_stack_fffffffffffffc98);
    local_38 = (undefined1  [16])IVar7;
    std::__cxx11::string::~string(local_60);
    BerdySensor::BerdySensor((BerdySensor *)0x5204cb);
    puVar2 = (undefined8 *)iDynTree::SensorsList::Iterator::operator*(local_28);
    local_c8._32_4_ = (**(code **)(*(long *)*puVar2 + 0x18))();
    puVar2 = (undefined8 *)iDynTree::SensorsList::Iterator::operator*(local_28);
    (**(code **)(*(long *)*puVar2 + 0x10))(local_c8);
    std::__cxx11::string::operator=(local_a0,local_c8);
    std::__cxx11::string::~string(local_c8);
    local_80 = (IndexRange)local_38;
    std::vector<iDynTree::BerdySensor,_std::allocator<iDynTree::BerdySensor>_>::push_back
              ((vector<iDynTree::BerdySensor,_std::allocator<iDynTree::BerdySensor>_> *)
               in_stack_fffffffffffffc90._M_current,in_stack_fffffffffffffc88);
    BerdySensor::~BerdySensor((BerdySensor *)0x52058f);
    iDynTree::SensorsList::Iterator::operator++(local_28);
  }
  if ((*(byte *)(in_RDI + 0x1b5) & 1) != 0) {
    local_d0 = 0;
    while( true ) {
      lVar5 = local_d0;
      lVar4 = iDynTree::Model::getNrOfDOFs();
      if (lVar4 <= lVar5) break;
      local_e0 = getRangeDOFSensorVariable
                           ((BerdyHelper *)in_stack_fffffffffffffc90._M_current,
                            (BerdySensorTypes)((ulong)in_stack_fffffffffffffc88 >> 0x20),
                            (DOFIndex)in_stack_fffffffffffffc80);
      BerdySensor::BerdySensor((BerdySensor *)0x520670);
      local_118 = 1000;
      iDynTree::Model::getJointName_abi_cxx11_((long)local_138);
      psVar8 = local_138;
      std::__cxx11::string::operator=(local_110,psVar8);
      std::__cxx11::string::~string(psVar8);
      local_f0 = local_e0.offset;
      pStack_e8 = local_e0.size;
      std::vector<iDynTree::BerdySensor,_std::allocator<iDynTree::BerdySensor>_>::push_back
                ((vector<iDynTree::BerdySensor,_std::allocator<iDynTree::BerdySensor>_> *)
                 in_stack_fffffffffffffc90._M_current,in_stack_fffffffffffffc88);
      BerdySensor::~BerdySensor((BerdySensor *)0x5206f9);
      local_d0 = local_d0 + 1;
    }
  }
  if ((*(byte *)(in_RDI + 0x1b6) & 1) != 0) {
    local_140 = 0;
    while( true ) {
      lVar5 = local_140;
      lVar4 = iDynTree::Model::getNrOfDOFs();
      if (lVar4 <= lVar5) break;
      local_150 = getRangeDOFSensorVariable
                            ((BerdyHelper *)in_stack_fffffffffffffc90._M_current,
                             (BerdySensorTypes)((ulong)in_stack_fffffffffffffc88 >> 0x20),
                             (DOFIndex)in_stack_fffffffffffffc80);
      BerdySensor::BerdySensor((BerdySensor *)0x5207bd);
      local_188 = 0x3e9;
      iDynTree::Model::getJointName_abi_cxx11_((long)local_1a8);
      psVar8 = local_1a8;
      std::__cxx11::string::operator=(local_180,psVar8);
      std::__cxx11::string::~string(psVar8);
      local_160 = local_150.offset;
      pStack_158 = local_150.size;
      std::vector<iDynTree::BerdySensor,_std::allocator<iDynTree::BerdySensor>_>::push_back
                ((vector<iDynTree::BerdySensor,_std::allocator<iDynTree::BerdySensor>_> *)
                 in_stack_fffffffffffffc90._M_current,in_stack_fffffffffffffc88);
      BerdySensor::~BerdySensor((BerdySensor *)0x520846);
      local_140 = local_140 + 1;
    }
  }
  if ((*(byte *)(in_RDI + 0x1b7) & 1) != 0) {
    local_1b0 = 0;
    while( true ) {
      lVar5 = local_1b0;
      lVar4 = iDynTree::Model::getNrOfLinks();
      if (lVar4 <= lVar5) break;
      iDynTree::Traversal::getBaseLink();
      lVar5 = iDynTree::Link::getIndex();
      if (((lVar5 != local_1b0) || (*(int *)(in_RDI + 0x1b0) != 0)) ||
         ((*(byte *)(in_RDI + 0x1b8) & 1) != 0)) {
        local_1c0 = getRangeLinkSensorVariable
                              ((BerdyHelper *)in_stack_fffffffffffffc90._M_current,
                               (BerdySensorTypes)((ulong)in_stack_fffffffffffffc88 >> 0x20),
                               (LinkIndex)in_stack_fffffffffffffc80);
        BerdySensor::BerdySensor((BerdySensor *)0x520957);
        local_218._32_4_ = 0x3ea;
        iDynTree::Model::getLinkName_abi_cxx11_((long)local_218);
        in_stack_fffffffffffffc90._M_current = (BerdySensor *)local_218;
        std::__cxx11::string::operator=
                  ((string *)(local_218 + 0x28),(string *)in_stack_fffffffffffffc90._M_current);
        std::__cxx11::string::~string((string *)in_stack_fffffffffffffc90._M_current);
        local_1d0 = local_1c0.offset;
        pStack_1c8 = local_1c0.size;
        std::vector<iDynTree::BerdySensor,_std::allocator<iDynTree::BerdySensor>_>::push_back
                  ((vector<iDynTree::BerdySensor,_std::allocator<iDynTree::BerdySensor>_> *)
                   in_stack_fffffffffffffc90._M_current,in_stack_fffffffffffffc88);
        BerdySensor::~BerdySensor((BerdySensor *)0x5209e0);
      }
      local_1b0 = local_1b0 + 1;
    }
  }
  local_220 = (value_type *)0x0;
  while( true ) {
    __last._M_current = local_220;
    pvVar6 = (value_type *)
             std::vector<long,_std::allocator<long>_>::size
                       ((vector<long,_std::allocator<long>_> *)(in_RDI + 0x308));
    if (pvVar6 <= __last._M_current) break;
    std::vector<long,_std::allocator<long>_>::operator[]
              ((vector<long,_std::allocator<long>_> *)(in_RDI + 0x308),(size_type)local_220);
    local_230 = getRangeJointSensorVariable
                          ((BerdyHelper *)in_stack_fffffffffffffc90._M_current,
                           (BerdySensorTypes)((ulong)__last._M_current >> 0x20),
                           (JointIndex)in_stack_fffffffffffffc80);
    BerdySensor::BerdySensor((BerdySensor *)0x520aad);
    local_288._32_4_ = 0x3eb;
    iDynTree::Model::getJointName_abi_cxx11_((long)local_288);
    in_stack_fffffffffffffc80 = (BerdyHelper *)local_288;
    std::__cxx11::string::operator=
              ((string *)(local_288 + 0x28),(string *)in_stack_fffffffffffffc80);
    std::__cxx11::string::~string((string *)in_stack_fffffffffffffc80);
    local_240 = local_230.offset;
    pStack_238 = local_230.size;
    std::vector<iDynTree::BerdySensor,_std::allocator<iDynTree::BerdySensor>_>::push_back
              ((vector<iDynTree::BerdySensor,_std::allocator<iDynTree::BerdySensor>_> *)
               in_stack_fffffffffffffc90._M_current,__last._M_current);
    BerdySensor::~BerdySensor((BerdySensor *)0x520b36);
    local_220 = (value_type *)((long)&local_220->type + 1);
  }
  if (*(int *)(in_RDI + 0x1b0) == 2) {
    local_298 = getRangeRCMSensorVariable(in_stack_fffffffffffffc80,in_stack_fffffffffffffc7c);
    BerdySensor::BerdySensor((BerdySensor *)0x520bb9);
    std::__cxx11::string::operator=(local_2c8,(string *)(in_RDI + 0x1d8));
    local_2a8 = local_298.offset;
    pStack_2a0 = local_298.size;
    std::vector<iDynTree::BerdySensor,_std::allocator<iDynTree::BerdySensor>_>::push_back
              ((vector<iDynTree::BerdySensor,_std::allocator<iDynTree::BerdySensor>_> *)
               in_stack_fffffffffffffc90._M_current,__last._M_current);
    BerdySensor::~BerdySensor((BerdySensor *)0x520c1d);
  }
  std::vector<iDynTree::BerdySensor,_std::allocator<iDynTree::BerdySensor>_>::begin
            ((vector<iDynTree::BerdySensor,_std::allocator<iDynTree::BerdySensor>_> *)
             CONCAT44(in_stack_fffffffffffffc7c,in_stack_fffffffffffffc78));
  std::vector<iDynTree::BerdySensor,_std::allocator<iDynTree::BerdySensor>_>::end
            ((vector<iDynTree::BerdySensor,_std::allocator<iDynTree::BerdySensor>_> *)
             CONCAT44(in_stack_fffffffffffffc7c,in_stack_fffffffffffffc78));
  std::
  sort<__gnu_cxx::__normal_iterator<iDynTree::BerdySensor*,std::vector<iDynTree::BerdySensor,std::allocator<iDynTree::BerdySensor>>>>
            (in_stack_fffffffffffffc90,__last);
  return;
}

Assistant:

void BerdyHelper::cacheSensorsOrdering()
{
    //TODO: reserve space
    unsigned size = 0;
    m_sensorsOrdering.clear();
    m_sensorsOrdering.reserve(size);

    //To be a bit more flexible, rely on getRangeSensorVariable to have the order of
    //the URDF sensors
    //???: Isn't this a loop in some way??
    for (SensorsList::Iterator it = m_model.sensors().allSensorsIterator();
         it.isValid(); ++it)
    {
        IndexRange sensorRange = this->getRangeSensorVariable((*it)->getSensorType(), m_model.sensors().getSensorIndex((*it)->getSensorType(), (*it)->getName()));

        BerdySensor sensor;
        sensor.type = static_cast<BerdySensorTypes>((*it)->getSensorType());
        sensor.id = (*it)->getName();
        sensor.range = sensorRange;
        m_sensorsOrdering.push_back(sensor);
    }


    //For each URDF sensor, get the offset with the function
    //put everything in a sorted list (sort with the offset)
    //the iterate and add the sensors to the vector

    //The remaining sensor order is hardcoded for now
    if (m_options.includeAllJointAccelerationsAsSensors)
    {
        for (DOFIndex idx = 0; idx < static_cast<DOFIndex>(m_model.getNrOfDOFs()); idx++)
        {
            IndexRange sensorRange = this->getRangeDOFSensorVariable(DOF_ACCELERATION_SENSOR,idx);
            BerdySensor jointAcc;
            jointAcc.type = DOF_ACCELERATION_SENSOR;
            jointAcc.id = m_model.getJointName(idx);
            jointAcc.range = sensorRange;
            m_sensorsOrdering.push_back(jointAcc);

        }
    }

    if (m_options.includeAllJointTorquesAsSensors)
    {
        for (DOFIndex idx = 0; idx < static_cast<DOFIndex>(m_model.getNrOfDOFs()); idx++)
        {
            IndexRange sensorRange = this->getRangeDOFSensorVariable(DOF_TORQUE_SENSOR,idx);
            BerdySensor jointSens;
            jointSens.type = DOF_TORQUE_SENSOR;
            jointSens.id = m_model.getJointName(idx);
            jointSens.range = sensorRange;
            m_sensorsOrdering.push_back(jointSens);
        }
    }

    if (m_options.includeAllNetExternalWrenchesAsSensors)
    {
        for (LinkIndex idx = 0; idx < static_cast<DOFIndex>(m_model.getNrOfLinks()); idx++)
        {
            // If this link is the (fixed) base link and the
            // berdy variant is ORIGINAL_BERDY_FIXED_BASE , then
            // the net wrench applied on the base is not part of the dynamical
            // system. Anyhow, we can still write the base wrench as a function
            // of sum of the joint wrenches of all the joints attached to the base (tipically just one)
            if (m_dynamicsTraversal.getBaseLink()->getIndex() == idx &&
                    (m_options.berdyVariant == ORIGINAL_BERDY_FIXED_BASE &&
                     !m_options.includeFixedBaseExternalWrench))
            {
                continue;
            }

            IndexRange sensorRange = this->getRangeLinkSensorVariable(NET_EXT_WRENCH_SENSOR, idx);
            BerdySensor linkSens;
            linkSens.type = NET_EXT_WRENCH_SENSOR;
            linkSens.id = m_model.getLinkName(idx);
            linkSens.range = sensorRange;
            m_sensorsOrdering.push_back(linkSens);

        }
    }

    for (size_t i = 0; i < this->berdySensorsInfo.wrenchSensors.size(); i++)
    {
        IndexRange sensorRange = this->getRangeJointSensorVariable(JOINT_WRENCH_SENSOR,berdySensorsInfo.wrenchSensors[i]);

        BerdySensor jointSens;
        jointSens.type = JOINT_WRENCH_SENSOR;
        jointSens.id = m_model.getJointName(i);
        jointSens.range = sensorRange;
        m_sensorsOrdering.push_back(jointSens);
    }

    if(m_options.berdyVariant==BERDY_FLOATING_BASE_NON_COLLOCATED_EXT_WRENCHES) {

        IndexRange sensorRange = this->getRangeRCMSensorVariable(RCM_SENSOR);

        BerdySensor linkSensor;
        linkSensor.type = RCM_SENSOR;
        linkSensor.id = m_options.baseLink;
        linkSensor.range = sensorRange;

        m_sensorsOrdering.push_back(linkSensor);
    }

    //To avoid any problem, sort m_sensorsOrdering by range.offset
    std::sort(m_sensorsOrdering.begin(), m_sensorsOrdering.end());

}